

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O2

ScalarFunction * duckdb::FormatFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffeac;
  FunctionNullHandling in_stack_fffffffffffffeb8;
  allocator_type local_141;
  bind_lambda_function_t in_stack_fffffffffffffec0;
  code *local_128 [2];
  code *local_118;
  code *local_110;
  LogicalType local_108;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_f0;
  LogicalType local_d8;
  BaseScalarFunction local_c0;
  
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffec0,VARCHAR);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xfffffffffffffec0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_f0,__l,&local_141);
  LogicalType::LogicalType(&local_108,VARCHAR);
  local_128[1] = (code *)0x0;
  local_128[0] = 
  PrintfFunction<duckdb::FMTFormat,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
  ;
  local_110 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_118 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_d8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_d8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffea4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffeac;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_f0,&local_108,
             (scalar_function_t *)local_128,BindPrintfFunction,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0);
  LogicalType::~LogicalType(&local_d8);
  ::std::_Function_base::~_Function_base((_Function_base *)local_128);
  LogicalType::~LogicalType(&local_108);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_f0);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffec0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffec0,ANY);
  LogicalType::operator=
            (&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs,
             (LogicalType *)&stack0xfffffffffffffec0);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffec0);
  BaseScalarFunction::SetReturnsError(&local_c0,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_c0);
  return in_RDI;
}

Assistant:

ScalarFunction FormatFun::GetFunction() {
	// duckdb_fmt::format_context, duckdb_fmt::vformat
	ScalarFunction format_fun({LogicalType::VARCHAR}, LogicalType::VARCHAR,
	                          PrintfFunction<FMTFormat, duckdb_fmt::format_context>, BindPrintfFunction);
	format_fun.varargs = LogicalType::ANY;
	BaseScalarFunction::SetReturnsError(format_fun);
	return format_fun;
}